

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

int __thiscall soplex::LPColSetBase<double>::remove(LPColSetBase<double> *this,char *__filename)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  double *pdVar4;
  int *piVar5;
  int i;
  int n;
  int in_stack_ffffffffffffff9c;
  VectorBase<double> *in_stack_ffffffffffffffa0;
  DataArray<int> *this_00;
  double in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  int local_18;
  
  iVar3 = num((LPColSetBase<double> *)0x23006d);
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,__filename);
  for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
    if ((-1 < *(int *)(__filename + (long)local_18 * 4)) &&
       (*(int *)(__filename + (long)local_18 * 4) != local_18)) {
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      *pdVar4 = dVar1;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffc8 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      *pdVar4 = in_stack_ffffffffffffffc8;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffd0 = (VectorBase<double> *)*pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      *pdVar4 = (double)in_stack_ffffffffffffffd0;
      piVar5 = DataArray<int>::operator[](&this->scaleExp,local_18);
      iVar2 = *piVar5;
      piVar5 = DataArray<int>::operator[](&this->scaleExp,*(int *)(__filename + (long)local_18 * 4))
      ;
      *piVar5 = iVar2;
    }
  }
  this_00 = (DataArray<int> *)&this->low;
  num((LPColSetBase<double> *)0x2301f7);
  VectorBase<double>::reDim
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
  num((LPColSetBase<double> *)0x230220);
  VectorBase<double>::reDim
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
  num((LPColSetBase<double> *)0x230249);
  VectorBase<double>::reDim
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
  num((LPColSetBase<double> *)0x230272);
  DataArray<int>::reSize(this_00,in_stack_ffffffffffffff9c);
  return extraout_EAX;
}

Assistant:

void remove(int perm[])
   {
      int n = num();

      SVSetBase<R>::remove(perm);

      for(int i = 0; i < n; ++i)
      {
         if(perm[i] >= 0 && perm[i] != i)
         {
            low[perm[i]] = low[i];
            up[perm[i]] = up[i];
            object[perm[i]] = object[i];
            scaleExp[perm[i]] = scaleExp[i];
         }
      }

      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }